

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O0

void Abc_DesPrint(Abc_Des_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  int local_28;
  int local_24;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  Abc_Des_t *p_local;
  
  printf("Models of design %s:\n",p->pName);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vModules), local_24 < iVar1; local_24 = local_24 + 1) {
    pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(p->vModules,local_24);
    printf("%2d : %20s   ",(ulong)(local_24 + 1),pNtk_00->pName);
    uVar2 = Abc_NtkNodeNum(pNtk_00);
    uVar3 = Abc_NtkLatchNum(pNtk_00);
    uVar4 = Abc_NtkWhiteboxNum(pNtk_00);
    uVar5 = Abc_NtkBlackboxNum(pNtk_00);
    printf("nd = %6d   lat = %6d   whitebox = %3d   blackbox = %3d\n",(ulong)uVar2,(ulong)uVar3,
           (ulong)uVar4,(ulong)uVar5);
    iVar1 = Abc_NtkBlackboxNum(pNtk_00);
    if (iVar1 != 0) {
      for (local_28 = 0; iVar1 = Vec_PtrSize(pNtk_00->vBoxes), local_28 < iVar1;
          local_28 = local_28 + 1) {
        pAVar6 = Abc_NtkBox(pNtk_00,local_28);
        iVar1 = Abc_ObjIsWhitebox(pAVar6);
        if (iVar1 != 0) {
          pcVar7 = Abc_NtkName((Abc_Ntk_t *)(pAVar6->field_5).pData);
          printf("     %20s (whitebox)\n",pcVar7);
        }
      }
      for (local_28 = 0; iVar1 = Vec_PtrSize(pNtk_00->vBoxes), local_28 < iVar1;
          local_28 = local_28 + 1) {
        pAVar6 = Abc_NtkBox(pNtk_00,local_28);
        iVar1 = Abc_ObjIsBlackbox(pAVar6);
        if (iVar1 != 0) {
          pcVar7 = Abc_NtkName((Abc_Ntk_t *)(pAVar6->field_5).pData);
          printf("     %20s (blackbox)\n",pcVar7);
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_DesPrint( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj;
    int i, k;
    printf( "Models of design %s:\n", p->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        printf( "%2d : %20s   ", i+1, pNtk->pName );
        printf( "nd = %6d   lat = %6d   whitebox = %3d   blackbox = %3d\n", 
            Abc_NtkNodeNum(pNtk), Abc_NtkLatchNum(pNtk), 
            Abc_NtkWhiteboxNum(pNtk), Abc_NtkBlackboxNum(pNtk) );
        if ( Abc_NtkBlackboxNum(pNtk) == 0 )
            continue;
        Abc_NtkForEachWhitebox( pNtk, pObj, k )
            printf( "     %20s (whitebox)\n", Abc_NtkName((Abc_Ntk_t *)pObj->pData) );
        Abc_NtkForEachBlackbox( pNtk, pObj, k )
            printf( "     %20s (blackbox)\n", Abc_NtkName((Abc_Ntk_t *)pObj->pData) );
    }
}